

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O2

size_t ra_portable_serialize(roaring_array_t *ra,char *buf)

{
  byte *pbVar1;
  ulong uVar2;
  _Bool _Var3;
  short sVar4;
  int32_t i;
  int32_t iVar6;
  void *__src;
  ulong uVar7;
  uint8_t uVar8;
  run_container_t *run;
  array_container_t *container;
  int32_t k;
  ulong __nmemb;
  long lVar9;
  int iVar10;
  uint16_t *buf_00;
  int iVar5;
  
  _Var3 = ra_has_run_container(ra);
  if (_Var3) {
    *(int32_t *)buf = ra->size * 0x10000 + -0xcfc5;
    uVar2 = (long)(ra->size + 7) / 8;
    __nmemb = uVar2 & 0xffffffff;
    __src = roaring_calloc(__nmemb,1);
    for (uVar7 = 0; (long)uVar7 < (long)ra->size; uVar7 = uVar7 + 1) {
      uVar8 = ra->typecodes[uVar7];
      if (uVar8 == '\x04') {
        uVar8 = *(uint8_t *)((long)ra->containers[uVar7] + 8);
      }
      if (uVar8 == '\x03') {
        pbVar1 = (byte *)((long)__src + (uVar7 >> 3 & 0x1fffffff));
        *pbVar1 = *pbVar1 | '\x01' << ((byte)uVar7 & 7);
      }
    }
    memcpy(buf + 4,__src,__nmemb);
    buf_00 = (uint16_t *)(buf + __nmemb + 4);
    roaring_free(__src);
    iVar5 = ra->size;
    iVar10 = iVar5 * 8;
    if (iVar5 < 4) {
      iVar10 = iVar5 * 4;
    }
    iVar10 = iVar10 + 4 + (int)uVar2;
  }
  else {
    buf[0] = ':';
    buf[1] = '0';
    buf[2] = '\0';
    buf[3] = '\0';
    *(int32_t *)(buf + 4) = ra->size;
    buf_00 = (uint16_t *)(buf + 8);
    iVar5 = ra->size;
    iVar10 = iVar5 * 8 + 8;
  }
  for (lVar9 = 0; lVar9 < iVar5; lVar9 = lVar9 + 1) {
    *buf_00 = ra->keys[lVar9];
    run = (run_container_t *)ra->containers[lVar9];
    uVar8 = ra->typecodes[lVar9];
    if (uVar8 == '\x04') {
      uVar8 = *(uint8_t *)&run->runs;
      run = *(run_container_t **)run;
    }
    if (uVar8 == '\x03') {
      iVar5 = run_container_cardinality(run);
      sVar4 = (short)iVar5;
    }
    else {
      sVar4 = (short)run->n_runs;
    }
    buf_00[1] = sVar4 - 1;
    buf_00 = buf_00 + 2;
    iVar5 = ra->size;
  }
  if (!_Var3 || 3 < iVar5) {
    for (lVar9 = 0; lVar9 < iVar5; lVar9 = lVar9 + 1) {
      *(int *)buf_00 = iVar10;
      buf_00 = buf_00 + 2;
      iVar6 = container_size_in_bytes(ra->containers[lVar9],ra->typecodes[lVar9]);
      iVar10 = iVar10 + iVar6;
      iVar5 = ra->size;
    }
  }
  for (lVar9 = 0; lVar9 < iVar5; lVar9 = lVar9 + 1) {
    container = (array_container_t *)ra->containers[lVar9];
    uVar8 = ra->typecodes[lVar9];
    if (uVar8 == '\x04') {
      uVar8 = *(uint8_t *)&container->array;
      container = *(array_container_t **)container;
    }
    if (uVar8 == '\x03') {
      iVar10 = run_container_write((run_container_t *)container,(char *)buf_00);
    }
    else if (uVar8 == '\x02') {
      iVar10 = array_container_write(container,(char *)buf_00);
    }
    else {
      iVar10 = bitset_container_write((bitset_container_t *)container,(char *)buf_00);
    }
    buf_00 = (uint16_t *)((long)buf_00 + (long)iVar10);
    iVar5 = ra->size;
  }
  return (long)buf_00 - (long)buf;
}

Assistant:

size_t ra_portable_serialize(const roaring_array_t *ra, char *buf) {
    char *initbuf = buf;
    uint32_t startOffset = 0;
    bool hasrun = ra_has_run_container(ra);
    if (hasrun) {
        uint32_t cookie = SERIAL_COOKIE | ((uint32_t)(ra->size - 1) << 16);
        memcpy(buf, &cookie, sizeof(cookie));
        buf += sizeof(cookie);
        uint32_t s = (ra->size + 7) / 8;
        uint8_t *bitmapOfRunContainers = (uint8_t *)roaring_calloc(s, 1);
        assert(bitmapOfRunContainers != NULL);  // todo: handle
        for (int32_t i = 0; i < ra->size; ++i) {
            if (get_container_type(ra->containers[i], ra->typecodes[i]) ==
                RUN_CONTAINER_TYPE) {
                bitmapOfRunContainers[i / 8] |= (1 << (i % 8));
            }
        }
        memcpy(buf, bitmapOfRunContainers, s);
        buf += s;
        roaring_free(bitmapOfRunContainers);
        if (ra->size < NO_OFFSET_THRESHOLD) {
            startOffset = 4 + 4 * ra->size + s;
        } else {
            startOffset = 4 + 8 * ra->size + s;
        }
    } else {  // backwards compatibility
        uint32_t cookie = SERIAL_COOKIE_NO_RUNCONTAINER;

        memcpy(buf, &cookie, sizeof(cookie));
        buf += sizeof(cookie);
        memcpy(buf, &ra->size, sizeof(ra->size));
        buf += sizeof(ra->size);

        startOffset = 4 + 4 + 4 * ra->size + 4 * ra->size;
    }
    for (int32_t k = 0; k < ra->size; ++k) {
        memcpy(buf, &ra->keys[k], sizeof(ra->keys[k]));
        buf += sizeof(ra->keys[k]);
        // get_cardinality returns a value in [1,1<<16], subtracting one
        // we get [0,1<<16 - 1] which fits in 16 bits
        uint16_t card = (uint16_t)(container_get_cardinality(ra->containers[k],
                                                             ra->typecodes[k]) -
                                   1);
        memcpy(buf, &card, sizeof(card));
        buf += sizeof(card);
    }
    if ((!hasrun) || (ra->size >= NO_OFFSET_THRESHOLD)) {
        // writing the containers offsets
        for (int32_t k = 0; k < ra->size; k++) {
            memcpy(buf, &startOffset, sizeof(startOffset));
            buf += sizeof(startOffset);
            startOffset =
                startOffset +
                container_size_in_bytes(ra->containers[k], ra->typecodes[k]);
        }
    }
    for (int32_t k = 0; k < ra->size; ++k) {
        buf += container_write(ra->containers[k], ra->typecodes[k], buf);
    }
    return buf - initbuf;
}